

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populateFloatingArgs
          (CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  element_type *peVar1;
  ConfigData *pCVar2;
  const_reference pvVar3;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_RDX;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_RSI;
  value_type *in_RDI;
  Token *token;
  size_t i;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *unusedTokens;
  ConfigData *config_00;
  value_type *__x;
  ConfigData *local_30;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *this_00;
  
  __x = in_RDI;
  this_00 = in_RSI;
  peVar1 = std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::get
                     ((auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> *)
                      &in_RSI[3].
                       super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if (peVar1 == (element_type *)0x0) {
    std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::vector(this_00,in_RDX)
    ;
  }
  else {
    std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::vector
              ((vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)0x198861);
    local_30 = (ConfigData *)0x0;
    while (config_00 = local_30,
          pCVar2 = (ConfigData *)
                   std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::size
                             (in_RDX), config_00 < pCVar2) {
      pvVar3 = std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator[]
                         (in_RDX,(size_type)local_30);
      if (pvVar3->type == Positional) {
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::operator->
                  ((auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> *)
                   &in_RSI[3].
                    super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
        Detail::BoundArgFunction<Catch::ConfigData>::set
                  ((BoundArgFunction<Catch::ConfigData> *)in_RDI,config_00,(string *)0x1988cf);
      }
      else {
        std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::push_back
                  (in_RSI,__x);
      }
      local_30 = (ConfigData *)&local_30->listTags;
    }
  }
  return (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)__x;
}

Assistant:

std::vector<Parser::Token> populateFloatingArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            if( !m_arg.get() )
                return tokens;
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                if( token.type == Parser::Token::Positional )
                    m_arg->boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }